

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::
ReadLogicalExpr(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>
                *this,int opcode)

{
  Kind KVar1;
  char *pcVar2;
  int iVar3;
  OpCodeInfo *pOVar4;
  BinaryReader<mp::internal::EndiannessConverter> *this_00;
  PairwiseArgHandler args;
  LogicalArgHandler args_1;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::NumericExprReader>
  args_3;
  BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::LogicalExprReader>
  args_2;
  
  pOVar4 = GetOpCodeInfo(opcode);
  KVar1 = pOVar4->first_kind;
  switch(KVar1) {
  case ATLEAST:
    ReadNumericExpr(this,false);
    this_00 = this->reader_;
    pcVar2 = (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_;
    (this_00->super_BinaryReaderBase).super_ReaderBase.token_ = pcVar2;
    (this_00->super_BinaryReaderBase).super_ReaderBase.ptr_ = pcVar2 + 1;
    if (*pcVar2 == 'o') {
      iVar3 = ReadOpCode(this);
      pOVar4 = GetOpCodeInfo(iVar3);
      if (pOVar4->kind == COUNT) goto LAB_00188737;
      this_00 = this->reader_;
    }
    BinaryReaderBase::ReportError<>(&this_00->super_BinaryReaderBase,(CStringRef)0x213782);
LAB_00188737:
    ReadCountExpr(this);
    return;
  case ATMOST:
  case EXACTLY:
  case NOT_ATLEAST:
  case NOT_ATMOST:
  case LAST_LOGICAL_COUNT:
  case FORALL:
switchD_001886f2_caseD_3c:
    BinaryReaderBase::ReportError<>(&this->reader_->super_BinaryReaderBase,(CStringRef)0x2151e2);
    return;
  case IMPLICATION:
    ReadLogicalExpr(this);
    ReadLogicalExpr(this);
LAB_0018877b:
    ReadLogicalExpr(this);
    return;
  case EXISTS:
    iVar3 = ReadNumArgs(this,3);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::LogicalExprReader,TestNLHandler2::LogicalArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>
                *)this,iVar3,&args_1);
    break;
  case ALLDIFF:
    iVar3 = ReadNumArgs(this,1);
    NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::
    DoReadArgs<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>::NumericExprReader,TestNLHandler2::PairwiseArgHandler>
              ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,TestNLHandler2>
                *)this,iVar3,&args);
    break;
  default:
    if (KVar1 == FIRST_RELATIONAL) {
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::NumericExprReader>
      ::BinaryArgReader(&args_3,this);
    }
    else {
      if (KVar1 != FIRST_BINARY_LOGICAL) {
        if (KVar1 == NOT) goto LAB_0018877b;
        goto switchD_001886f2_caseD_3c;
      }
      BinaryArgReader<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_TestNLHandler2>::LogicalExprReader>
      ::BinaryArgReader(&args_2,this);
    }
  }
  return;
}

Assistant:

typename Handler::LogicalExpr
    NLReader<Reader, Handler>::ReadLogicalExpr(int opcode) {
  const internal::OpCodeInfo &info = internal::GetOpCodeInfo(opcode);
  expr::Kind kind = info.kind;
  switch (info.first_kind) {
  case expr::NOT:
    return handler_.OnNot(ReadLogicalExpr());
  case expr::FIRST_BINARY_LOGICAL: {
    BinaryArgReader<LogicalExprReader> args(*this);
    return handler_.OnBinaryLogical(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_RELATIONAL: {
    BinaryArgReader<> args(*this);
    return handler_.OnRelational(kind, args.lhs, args.rhs);
  }
  case expr::FIRST_LOGICAL_COUNT: {
    NumericExpr lhs = ReadNumericExpr();
    char c = reader_.ReadChar();
    if (c != 'o' || internal::GetOpCodeInfo(ReadOpCode()).kind != expr::COUNT)
      reader_.ReportError("expected count expression");
    return handler_.OnLogicalCount(kind, lhs, ReadCountExpr());
  }
  case expr::IMPLICATION: {
    // Read an implication (=>).
    LogicalExpr condition = ReadLogicalExpr();
    LogicalExpr then_expr = ReadLogicalExpr();
    LogicalExpr else_expr = ReadLogicalExpr();
    return handler_.OnImplication(condition, then_expr, else_expr);
  }
  case expr::FIRST_ITERATED_LOGICAL: {
    // Read an iterated logical expression (exists or forall).
    int num_args = ReadNumArgs();
    typename Handler::LogicalArgHandler args =
        handler_.BeginIteratedLogical(kind, num_args);
    ReadArgs<LogicalExprReader>(num_args, args);
    return handler_.EndIteratedLogical(args);
  }
  case expr::FIRST_PAIRWISE: {
    // Read a pairwise expression (alldiff or !alldiff).
    int num_args = ReadNumArgs(1);
    typename Handler::PairwiseArgHandler args =
        handler_.BeginPairwise(kind, num_args);
    ReadArgs<NumericExprReader>(num_args, args);
    return handler_.EndPairwise(args);
  }
  default:
    reader_.ReportError("expected logical expression opcode");
  }
  return LogicalExpr();
}